

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_intrin_sse2.c
# Opt level: O0

int64_t av1_block_error_lp_sse2(int16_t *coeff,int16_t *dqcoeff,intptr_t block_size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int64_t extraout_XMM0_Qa;
  __m128i reg;
  __m128i accum;
  __m128i error_hi_1;
  __m128i error_hi_0;
  __m128i error_lo_1;
  __m128i error_lo_0;
  __m128i error_1;
  __m128i error_0;
  __m128i diff_1;
  __m128i diff_0;
  __m128i _dqcoeff_1;
  __m128i _dqcoeff_0;
  __m128i _coeff_1;
  __m128i _coeff_0;
  int i;
  __m128i accum_1;
  __m128i accum_0;
  __m128i zero;
  int local_23c;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  
  local_1f8 = in_RSI;
  local_1f0 = in_RDI;
  for (local_23c = 0; local_23c < in_RDX; local_23c = local_23c + 0x10) {
    uVar1 = *local_1f0;
    uVar2 = local_1f0[1];
    uVar3 = local_1f0[2];
    uVar4 = local_1f0[3];
    uVar5 = *local_1f8;
    uVar6 = local_1f8[1];
    uVar7 = local_1f8[2];
    uVar8 = local_1f8[3];
    local_188 = (short)uVar5;
    sStack_186 = (short)((ulong)uVar5 >> 0x10);
    sStack_184 = (short)((ulong)uVar5 >> 0x20);
    sStack_182 = (short)((ulong)uVar5 >> 0x30);
    sStack_180 = (short)uVar6;
    sStack_17e = (short)((ulong)uVar6 >> 0x10);
    sStack_17c = (short)((ulong)uVar6 >> 0x20);
    sStack_17a = (short)((ulong)uVar6 >> 0x30);
    local_198 = (short)uVar1;
    sStack_196 = (short)((ulong)uVar1 >> 0x10);
    sStack_194 = (short)((ulong)uVar1 >> 0x20);
    sStack_192 = (short)((ulong)uVar1 >> 0x30);
    sStack_190 = (short)uVar2;
    sStack_18e = (short)((ulong)uVar2 >> 0x10);
    sStack_18c = (short)((ulong)uVar2 >> 0x20);
    sStack_18a = (short)((ulong)uVar2 >> 0x30);
    local_1a8 = (short)uVar7;
    sStack_1a6 = (short)((ulong)uVar7 >> 0x10);
    sStack_1a4 = (short)((ulong)uVar7 >> 0x20);
    sStack_1a2 = (short)((ulong)uVar7 >> 0x30);
    sStack_1a0 = (short)uVar8;
    sStack_19e = (short)((ulong)uVar8 >> 0x10);
    sStack_19c = (short)((ulong)uVar8 >> 0x20);
    sStack_19a = (short)((ulong)uVar8 >> 0x30);
    local_1b8 = (short)uVar3;
    sStack_1b6 = (short)((ulong)uVar3 >> 0x10);
    sStack_1b4 = (short)((ulong)uVar3 >> 0x20);
    sStack_1b2 = (short)((ulong)uVar3 >> 0x30);
    sStack_1b0 = (short)uVar4;
    sStack_1ae = (short)((ulong)uVar4 >> 0x10);
    sStack_1ac = (short)((ulong)uVar4 >> 0x20);
    sStack_1aa = (short)((ulong)uVar4 >> 0x30);
    uVar1 = CONCAT26(sStack_182 - sStack_192,
                     CONCAT24(sStack_184 - sStack_194,
                              CONCAT22(sStack_186 - sStack_196,local_188 - local_198)));
    uVar2 = CONCAT26(sStack_17a - sStack_18a,
                     CONCAT24(sStack_17c - sStack_18c,
                              CONCAT22(sStack_17e - sStack_18e,sStack_180 - sStack_190)));
    auVar12._8_8_ = uVar2;
    auVar12._0_8_ = uVar1;
    auVar11._8_8_ = uVar2;
    auVar11._0_8_ = uVar1;
    pmaddwd(auVar12,auVar11);
    uVar1 = CONCAT26(sStack_1a2 - sStack_1b2,
                     CONCAT24(sStack_1a4 - sStack_1b4,
                              CONCAT22(sStack_1a6 - sStack_1b6,local_1a8 - local_1b8)));
    uVar2 = CONCAT26(sStack_19a - sStack_1aa,
                     CONCAT24(sStack_19c - sStack_1ac,
                              CONCAT22(sStack_19e - sStack_1ae,sStack_1a0 - sStack_1b0)));
    auVar10._8_8_ = uVar2;
    auVar10._0_8_ = uVar1;
    auVar9._8_8_ = uVar2;
    auVar9._0_8_ = uVar1;
    pmaddwd(auVar10,auVar9);
    local_1f0 = local_1f0 + 4;
    local_1f8 = local_1f8 + 4;
  }
  reg[1] = (longlong)in_RSI;
  reg[0] = (longlong)in_RDI;
  reduce_sum_epi64(reg);
  return extraout_XMM0_Qa;
}

Assistant:

int64_t av1_block_error_lp_sse2(const int16_t *coeff, const int16_t *dqcoeff,
                                intptr_t block_size) {
  assert(block_size % 16 == 0);
  assert(block_size >= 16);

  const __m128i zero = _mm_setzero_si128();
  __m128i accum_0 = zero;
  __m128i accum_1 = zero;

  for (int i = 0; i < block_size; i += 16) {
    // Load 8 elements for coeff and dqcoeff.
    const __m128i _coeff_0 = _mm_loadu_si128((const __m128i *)coeff);
    const __m128i _coeff_1 = _mm_loadu_si128((const __m128i *)(coeff + 8));
    const __m128i _dqcoeff_0 = _mm_loadu_si128((const __m128i *)dqcoeff);
    const __m128i _dqcoeff_1 = _mm_loadu_si128((const __m128i *)(dqcoeff + 8));
    // Compute the diff
    const __m128i diff_0 = _mm_sub_epi16(_dqcoeff_0, _coeff_0);
    const __m128i diff_1 = _mm_sub_epi16(_dqcoeff_1, _coeff_1);
    // Compute the error
    const __m128i error_0 = _mm_madd_epi16(diff_0, diff_0);
    const __m128i error_1 = _mm_madd_epi16(diff_1, diff_1);

    const __m128i error_lo_0 = _mm_unpacklo_epi32(error_0, zero);
    const __m128i error_lo_1 = _mm_unpacklo_epi32(error_1, zero);
    const __m128i error_hi_0 = _mm_unpackhi_epi32(error_0, zero);
    const __m128i error_hi_1 = _mm_unpackhi_epi32(error_1, zero);

    // Accumulate
    accum_0 = _mm_add_epi64(accum_0, error_lo_0);
    accum_1 = _mm_add_epi64(accum_1, error_lo_1);
    accum_0 = _mm_add_epi64(accum_0, error_hi_0);
    accum_1 = _mm_add_epi64(accum_1, error_hi_1);

    // Advance
    coeff += 16;
    dqcoeff += 16;
  }

  __m128i accum = _mm_add_epi64(accum_0, accum_1);
  // Reduce sum the register
  accum = reduce_sum_epi64(accum);

  // Store the results.
#if AOM_ARCH_X86_64
  return _mm_cvtsi128_si64(accum);
#else
  int64_t result;
  _mm_storel_epi64((__m128i *)&result, accum);
  return result;
#endif  // AOM_ARCH_X86_64
}